

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

void Bt3_MatchFinder_Skip(CMatchFinder *p,UInt32 num)

{
  uint lenLimit_00;
  UInt32 curMatch_00;
  byte *pbVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int in_ESI;
  long *in_RDI;
  UInt32 temp;
  UInt32 curMatch;
  Byte *cur;
  UInt32 hv;
  UInt32 lenLimit;
  UInt32 *hash;
  UInt32 h2;
  int local_c;
  
  local_c = in_ESI;
  do {
    lenLimit_00 = *(uint *)((long)in_RDI + 0x14);
    if (lenLimit_00 < 3) {
      MatchFinder_MovePos((CMatchFinder *)0x12129a);
    }
    else {
      pbVar1 = (byte *)*in_RDI;
      uVar4 = *(uint *)((long)in_RDI + (ulong)*pbVar1 * 4 + 0x78) ^ (uint)pbVar1[1];
      uVar5 = (uVar4 ^ (uint)pbVar1[2] << 8) & *(uint *)(in_RDI + 7);
      lVar2 = in_RDI[5];
      curMatch_00 = *(UInt32 *)(lVar2 + (ulong)(uVar5 + 0x400) * 4);
      lVar3 = in_RDI[1];
      *(int *)(lVar2 + (ulong)(uVar5 + 0x400) * 4) = (int)lVar3;
      *(int *)(lVar2 + (ulong)(uVar4 & 0x3ff) * 4) = (int)lVar3;
      SkipMatchesSpec(lenLimit_00,curMatch_00,*(UInt32 *)(in_RDI + 1),(Byte *)*in_RDI,
                      (CLzRef *)in_RDI[6],*(UInt32 *)(in_RDI + 3),*(UInt32 *)((long)in_RDI + 0x1c),
                      *(UInt32 *)((long)in_RDI + 0x3c));
      *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
      *in_RDI = *in_RDI + 1;
      iVar6 = (int)in_RDI[1] + 1;
      *(int *)(in_RDI + 1) = iVar6;
      if (iVar6 == *(int *)((long)in_RDI + 0xc)) {
        MatchFinder_CheckLimits((CMatchFinder *)0x1213cc);
      }
    }
    local_c = local_c + -1;
  } while (local_c != 0);
  return;
}

Assistant:

static void Bt3_MatchFinder_Skip(CMatchFinder *p, UInt32 num)
{
  do
  {
    UInt32 h2;
    UInt32 *hash;
    SKIP_HEADER(3)
    HASH3_CALC;
    hash = p->hash;
    curMatch = hash[kFix3HashSize + hv];
    hash[h2] =
    hash[kFix3HashSize + hv] = p->pos;
    SKIP_FOOTER
  }
  while (--num != 0);
}